

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ThreadCreate(SQLiteThread **ppThread,_func_void_ptr_void_ptr *xTask,void *pIn)

{
  int iVar1;
  SQLiteThread *__newthread;
  void *pvVar2;
  int local_34;
  int rc;
  SQLiteThread *p;
  void *pIn_local;
  _func_void_ptr_void_ptr *xTask_local;
  SQLiteThread **ppThread_local;
  
  *ppThread = (SQLiteThread *)0x0;
  __newthread = (SQLiteThread *)sqlite3Malloc(0x28);
  if (__newthread == (SQLiteThread *)0x0) {
    ppThread_local._4_4_ = 7;
  }
  else {
    memset(__newthread,0,0x28);
    __newthread->xTask = xTask;
    __newthread->pIn = pIn;
    iVar1 = sqlite3FaultSim(200);
    if (iVar1 == 0) {
      local_34 = pthread_create((pthread_t *)__newthread,(pthread_attr_t *)0x0,
                                (__start_routine *)xTask,pIn);
    }
    else {
      local_34 = 1;
    }
    if (local_34 != 0) {
      __newthread->done = 1;
      pvVar2 = (*xTask)(pIn);
      __newthread->pOut = pvVar2;
    }
    *ppThread = __newthread;
    ppThread_local._4_4_ = 0;
  }
  return ppThread_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ThreadCreate(
  SQLiteThread **ppThread,  /* OUT: Write the thread object here */
  void *(*xTask)(void*),    /* Routine to run in a separate thread */
  void *pIn                 /* Argument passed into xTask() */
){
  SQLiteThread *p;
  int rc;

  assert( ppThread!=0 );
  assert( xTask!=0 );
  /* This routine is never used in single-threaded mode */
  assert( sqlite3GlobalConfig.bCoreMutex!=0 );

  *ppThread = 0;
  p = sqlite3Malloc(sizeof(*p));
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  memset(p, 0, sizeof(*p));
  p->xTask = xTask;
  p->pIn = pIn;
  /* If the SQLITE_TESTCTRL_FAULT_INSTALL callback is registered to a 
  ** function that returns SQLITE_ERROR when passed the argument 200, that
  ** forces worker threads to run sequentially and deterministically 
  ** for testing purposes. */
  if( sqlite3FaultSim(200) ){
    rc = 1;
  }else{    
    rc = pthread_create(&p->tid, 0, xTask, pIn);
  }
  if( rc ){
    p->done = 1;
    p->pOut = xTask(pIn);
  }
  *ppThread = p;
  return SQLITE_OK;
}